

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O2

int al_get_monitor_dpi(int adapter)

{
  _func_int_int *UNRECOVERED_JUMPTABLE;
  int iVar1;
  ALLEGRO_SYSTEM *pAVar2;
  
  pAVar2 = al_get_system_driver();
  iVar1 = al_get_num_video_adapters();
  if (((pAVar2 != (ALLEGRO_SYSTEM *)0x0 && adapter < iVar1) &&
      (pAVar2->vt != (ALLEGRO_SYSTEM_INTERFACE *)0x0)) &&
     (UNRECOVERED_JUMPTABLE = pAVar2->vt->get_monitor_dpi,
     UNRECOVERED_JUMPTABLE != (_func_int_int *)0x0)) {
    iVar1 = (*UNRECOVERED_JUMPTABLE)(adapter);
    return iVar1;
  }
  return 0;
}

Assistant:

int al_get_monitor_dpi(int adapter)
{
   ALLEGRO_SYSTEM *system = al_get_system_driver();

   if (adapter < al_get_num_video_adapters()) {
       if (system && system->vt && system->vt->get_monitor_dpi) {
           return system->vt->get_monitor_dpi(adapter);
       }
   }

   return 0;
}